

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O0

void decaf_448_point_dual_scalarmul
               (decaf_448_point_s *a1,decaf_448_point_s *a2,decaf_448_point_s *b,
               decaf_448_scalar_s *scalar1,decaf_448_scalar_s *scalar2)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  mask_t swap;
  ulong uVar15;
  mask_t inv2;
  mask_t inv1;
  word_t bits2;
  word_t bits1;
  int j;
  int i;
  pniels_t pn;
  decaf_448_point_t tmp;
  decaf_448_point_t working;
  decaf_448_point_t multiples2 [16];
  decaf_448_point_t multiples1 [16];
  decaf_448_scalar_t scalar2x;
  decaf_448_scalar_t scalar1x;
  int NTABLE;
  int WINDOW_T_MASK;
  int WINDOW_MASK;
  int WINDOW;
  word_t mask_2;
  big_register_t br_mask_2;
  word_t k_2;
  word_t j_3;
  uchar *table_2;
  uchar *out_1;
  big_register_t big_i_2;
  big_register_t big_one_2;
  word_t mask;
  big_register_t br_mask;
  word_t k;
  word_t j_1;
  uchar *table;
  uchar *out;
  big_register_t big_i;
  big_register_t big_one;
  word_t mask_3;
  big_register_t br_mask_3;
  word_t k_3;
  word_t j_4;
  uchar *table_3;
  uchar *in_1;
  big_register_t big_i_3;
  big_register_t big_one_3;
  word_t mask_1;
  big_register_t br_mask_1;
  word_t k_1;
  word_t j_2;
  uchar *table_1;
  uchar *in;
  big_register_t big_i_1;
  big_register_t big_one_1;
  big_register_t ret_3;
  uint32_t y_3;
  big_register_t ret_2;
  uint32_t y_2;
  big_register_t ret_7;
  uint32_t y_7;
  big_register_t ret_6;
  uint32_t y_6;
  big_register_t ret_1;
  uint32_t y_1;
  big_register_t ret;
  uint32_t y;
  big_register_t ret_5;
  uint32_t y_5;
  big_register_t ret_4;
  uint32_t y_4;
  decaf_448_point_s *in_stack_ffffffffffffd760;
  decaf_448_point_s *in_stack_ffffffffffffd768;
  decaf_448_scalar_s *in_stack_ffffffffffffd778;
  decaf_448_scalar_s *in_stack_ffffffffffffd780;
  undefined1 *puVar16;
  decaf_448_scalar_s *in_stack_ffffffffffffd788;
  decaf_word_t in_stack_ffffffffffffd798;
  gf_448_s *in_stack_ffffffffffffd7a0;
  anon_struct_256_2_948a309a *pn_00;
  decaf_448_point_s *p;
  uint local_2838;
  uint local_2830;
  int local_2828;
  int local_2824;
  gf_448_s local_2820;
  gf_448_s gStack_27e0;
  undefined4 in_stack_ffffffffffffd870;
  int in_stack_ffffffffffffd874;
  decaf_448_point_s *in_stack_ffffffffffffd878;
  decaf_448_point_s *in_stack_ffffffffffffd880;
  undefined1 local_2720 [256];
  undefined1 local_2620 [256];
  undefined1 local_2520 [4096];
  undefined1 local_1520 [4112];
  decaf_448_scalar_s local_510;
  decaf_448_scalar_s local_4d0;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  uint64_t local_458;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  ulong local_440;
  ulong local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  ulong local_400;
  ulong local_3f8;
  ulong local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  uint64_t local_3d8;
  int local_3d0;
  int iStack_3cc;
  int iStack_3c8;
  int iStack_3c4;
  ulong local_3c0;
  ulong local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  ulong local_380;
  ulong local_378;
  ulong local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  ulong local_358;
  gf_448_s *local_350;
  mask_t local_348;
  gf_448_s *local_340;
  uint64_t local_338;
  uint local_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  ulong local_320;
  ulong local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  uint64_t local_2b8;
  uint local_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  ulong local_2a0;
  ulong local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  uint local_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  uint local_220;
  ulong uStack_218;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1fc;
  undefined8 local_1f8;
  uint local_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  ulong uStack_1d8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1bc;
  undefined8 local_1b8;
  uint local_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  ulong uStack_198;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_17c;
  undefined8 local_178;
  uint local_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  ulong uStack_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_13c;
  undefined8 local_138;
  ulong local_130;
  ulong uStack_128;
  ulong local_120;
  ulong uStack_118;
  ulong local_110;
  ulong uStack_108;
  ulong local_100;
  ulong uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_484 = 5;
  local_488 = 0x1f;
  local_48c = 0xf;
  local_490 = 0x10;
  decaf_448_scalar_add
            (in_stack_ffffffffffffd788,in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
  decaf_448_scalar_halve(&local_4d0,&local_4d0);
  decaf_448_scalar_add
            (in_stack_ffffffffffffd788,in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
  decaf_448_scalar_halve(&local_510,&local_510);
  decaf_448_point_copy(in_stack_ffffffffffffd768,in_stack_ffffffffffffd760);
  for (local_2824 = 0; local_2824 < 0x10; local_2824 = local_2824 + 1) {
    decaf_448_point_copy(in_stack_ffffffffffffd768,in_stack_ffffffffffffd760);
    decaf_448_point_copy(in_stack_ffffffffffffd768,in_stack_ffffffffffffd760);
  }
  for (local_2824 = 0; local_2824 < 0x1be; local_2824 = local_2824 + 5) {
    if (local_2824 != 0) {
      for (local_2828 = 0; local_2828 < 4; local_2828 = local_2828 + 1) {
        point_double_internal
                  (in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,in_stack_ffffffffffffd874);
      }
      point_double_internal
                (in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,in_stack_ffffffffffffd874);
    }
    pn_00 = (anon_struct_256_2_948a309a *)local_4d0.limb[local_2824 / 0x40];
    local_2830 = (uint)((ulong)pn_00 >> ((byte)((long)local_2824 % 0x40) & 0x3f));
    p = (decaf_448_point_s *)local_510.limb[local_2824 / 0x40];
    local_2838 = (uint)((ulong)p >> ((byte)((long)local_2824 % 0x40) & 0x3f));
    if ((0x3a < local_2824 % 0x40) && (local_2824 / 0x40 < 6)) {
      in_stack_ffffffffffffd798 = local_4d0.limb[local_2824 / 0x40 + 1];
      local_2830 = (uint)(in_stack_ffffffffffffd798 << (0x40U - (char)(local_2824 % 0x40) & 0x3f)) ^
                   local_2830;
      in_stack_ffffffffffffd7a0 = (gf_448_s *)local_510.limb[local_2824 / 0x40 + 1];
      local_2838 = (uint)((long)in_stack_ffffffffffffd7a0 <<
                         (0x40U - (char)(local_2824 % 0x40) & 0x3f)) ^ local_2838;
    }
    swap = (ulong)((local_2830 & 0x1f) >> 4) - 1;
    uVar15 = (ulong)((local_2838 & 0x1f) >> 4) - 1;
    uVar13 = local_2830 & 0x1f ^ (uint)swap;
    uVar14 = local_2838 & 0x1f ^ (uint)uVar15;
    pt_to_pniels((anon_struct_256_2_948a309a *)in_stack_ffffffffffffd768,in_stack_ffffffffffffd760);
    local_1b0 = uVar13 & 0xf;
    local_380 = (ulong)local_1b0;
    local_3a8 = local_2720;
    local_3b0 = local_1520;
    local_370 = 0x100;
    local_378 = 0x10;
    local_178 = 1;
    local_17c = 1;
    local_190 = 1;
    uStack_18c = 1;
    uStack_188 = 1;
    uStack_184 = 1;
    local_390 = 0x100000001;
    uStack_388 = 0x100000001;
    local_3a0 = CONCAT44(uVar13,uVar13) & 0xf0000000f;
    uStack_398 = CONCAT44(uVar13,uVar13) & 0xf0000000f;
    local_368 = local_3b0;
    local_360 = local_3a8;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    local_1a0 = local_1b0;
    uStack_198 = local_380;
    memset(local_3a8,0,0x100);
    for (local_3b8 = 0; local_3b8 < local_378; local_3b8 = local_3b8 + 1) {
      local_110 = local_3a0;
      uStack_108 = uStack_398;
      local_60 = 0;
      uStack_58 = 0;
      local_c0 = local_3a0;
      uVar11 = local_c0;
      uStack_b8 = uStack_398;
      uVar12 = uStack_b8;
      local_d0 = 0;
      uStack_c8 = 0;
      local_c0._0_4_ = (int)local_3a0;
      local_c0._4_4_ = (int)(local_3a0 >> 0x20);
      uStack_b8._0_4_ = (int)uStack_398;
      uStack_b8._4_4_ = (int)(uStack_398 >> 0x20);
      local_3d0 = -(uint)((int)local_c0 == 0);
      iStack_3cc = -(uint)(local_c0._4_4_ == 0);
      iStack_3c8 = -(uint)((int)uStack_b8 == 0);
      iStack_3c4 = -(uint)(uStack_b8._4_4_ == 0);
      for (local_3c0 = 0; local_3c0 <= local_370 - 0x10; local_3c0 = local_3c0 + 0x10) {
        if ((local_370 & 0xf) == 0) {
          uVar10 = *(ulong *)((long)(local_3b0 + local_3c0 + local_3b8 * local_370) + 8);
          uVar9 = *(ulong *)((long)(local_3a8 + local_3c0) + 8);
          *(ulong *)(local_3a8 + local_3c0) =
               CONCAT44(iStack_3cc,local_3d0) &
               *(ulong *)(local_3b0 + local_3c0 + local_3b8 * local_370) |
               *(ulong *)(local_3a8 + local_3c0);
          *(ulong *)((long)(local_3a8 + local_3c0) + 8) =
               CONCAT44(iStack_3c4,iStack_3c8) & uVar10 | uVar9;
        }
        else {
          uVar10 = *(ulong *)((long)(local_3b0 + local_3c0 + local_3b8 * local_370) + 8);
          uVar9 = *(ulong *)((long)(local_3a8 + local_3c0) + 8);
          *(ulong *)(local_3a8 + local_3c0) =
               *(ulong *)(local_3a8 + local_3c0) |
               CONCAT44(iStack_3cc,local_3d0) &
               *(ulong *)(local_3b0 + local_3c0 + local_3b8 * local_370);
          *(ulong *)((long)(local_3a8 + local_3c0) + 8) =
               uVar9 | CONCAT44(iStack_3c4,iStack_3c8) & uVar10;
        }
      }
      local_c0 = uVar11;
      uStack_b8 = uVar12;
      local_3d8 = word_is_zero(local_380 ^ local_3b8);
      if (7 < (local_370 & 0xf)) {
        for (; local_3c0 <= local_370 - 8; local_3c0 = local_3c0 + 8) {
          if ((local_370 & 7) == 0) {
            *(uint64_t *)(local_3a8 + local_3c0) =
                 local_3d8 & *(ulong *)(local_3b0 + local_3c0 + local_3b8 * local_370) |
                 *(ulong *)(local_3a8 + local_3c0);
          }
          else {
            *(uint64_t *)(local_3a8 + local_3c0) =
                 local_3d8 & *(ulong *)(local_3b0 + local_3c0 + local_3b8 * local_370) |
                 *(ulong *)(local_3a8 + local_3c0);
          }
        }
      }
      if ((local_370 & 7) != 0) {
        for (; local_3c0 < local_370; local_3c0 = local_3c0 + 1) {
          local_3a8[local_3c0] =
               local_3a8[local_3c0] | (byte)local_3d8 & local_3b0[local_3c0 + local_3b8 * local_370]
          ;
        }
      }
      local_3a0 = CONCAT44(local_3a0._4_4_ - local_390._4_4_,(int)local_3a0 - (int)local_390);
      uStack_398 = CONCAT44(uStack_398._4_4_ - uStack_388._4_4_,(int)uStack_398 - (int)uStack_388);
    }
    local_340 = &local_2820;
    local_348 = swap;
    gf_cond_swap(local_340,&gStack_27e0,swap);
    gf_cond_neg(in_stack_ffffffffffffd7a0,in_stack_ffffffffffffd798);
    add_pniels_to_pt(p,pn_00,(int)((ulong)in_stack_ffffffffffffd7a0 >> 0x20));
    local_230 = uVar13 & 0xf;
    local_258 = (ulong)local_230;
    local_290 = local_1520;
    local_248 = 0x100;
    local_250 = 0x10;
    local_1f8 = 1;
    local_1fc = 1;
    local_210 = 1;
    uStack_20c = 1;
    uStack_208 = 1;
    uStack_204 = 1;
    local_270 = 0x100000001;
    uStack_268 = 0x100000001;
    local_280 = CONCAT44(uVar13,uVar13) & 0xf0000000f;
    uStack_278 = CONCAT44(uVar13,uVar13) & 0xf0000000f;
    local_288 = local_2720;
    local_240 = local_2720;
    local_238 = local_290;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    local_220 = local_230;
    uStack_218 = local_258;
    for (local_298 = 0; local_298 < local_250; local_298 = local_298 + 1) {
      local_130 = local_280;
      uStack_128 = uStack_278;
      local_40 = 0;
      uStack_38 = 0;
      local_80 = local_280;
      uVar11 = local_80;
      uStack_78 = uStack_278;
      uVar12 = uStack_78;
      local_90 = 0;
      uStack_88 = 0;
      local_80._0_4_ = (int)local_280;
      local_80._4_4_ = (int)(local_280 >> 0x20);
      uStack_78._0_4_ = (int)uStack_278;
      uStack_78._4_4_ = (int)(uStack_278 >> 0x20);
      local_2b0 = -(uint)((int)local_80 == 0);
      uStack_2ac = -(uint)(local_80._4_4_ == 0);
      uStack_2a8 = -(uint)((int)uStack_78 == 0);
      uStack_2a4 = -(uint)(uStack_78._4_4_ == 0);
      for (local_2a0 = 0; local_2a0 <= local_248 - 0x10; local_2a0 = local_2a0 + 0x10) {
        if ((local_248 & 0xf) == 0) {
          puVar1 = (uint *)(local_290 + local_2a0 + local_298 * local_248);
          uVar6 = puVar1[1];
          uVar7 = puVar1[2];
          uVar8 = puVar1[3];
          puVar2 = (uint *)(local_288 + local_2a0);
          uVar13 = puVar2[1];
          uVar4 = puVar2[2];
          uVar5 = puVar2[3];
          puVar3 = (uint *)(local_290 + local_2a0 + local_298 * local_248);
          *puVar3 = *puVar1 & (local_2b0 ^ 0xffffffff) | *puVar2 & local_2b0;
          puVar3[1] = uVar6 & (uStack_2ac ^ 0xffffffff) | uVar13 & uStack_2ac;
          puVar3[2] = uVar7 & (uStack_2a8 ^ 0xffffffff) | uVar4 & uStack_2a8;
          puVar3[3] = uVar8 & (uStack_2a4 ^ 0xffffffff) | uVar5 & uStack_2a4;
        }
        else {
          puVar1 = (uint *)(local_290 + local_2a0 + local_298 * local_248);
          uVar6 = puVar1[1];
          uVar7 = puVar1[2];
          uVar8 = puVar1[3];
          puVar2 = (uint *)(local_288 + local_2a0);
          uVar13 = puVar2[1];
          uVar4 = puVar2[2];
          uVar5 = puVar2[3];
          puVar3 = (uint *)(local_290 + local_2a0 + local_298 * local_248);
          *puVar3 = *puVar1 & (local_2b0 ^ 0xffffffff) | *puVar2 & local_2b0;
          puVar3[1] = uVar6 & (uStack_2ac ^ 0xffffffff) | uVar13 & uStack_2ac;
          puVar3[2] = uVar7 & (uStack_2a8 ^ 0xffffffff) | uVar4 & uStack_2a8;
          puVar3[3] = uVar8 & (uStack_2a4 ^ 0xffffffff) | uVar5 & uStack_2a4;
        }
      }
      local_80 = uVar11;
      uStack_78 = uVar12;
      local_2b8 = word_is_zero(local_258 ^ local_298);
      if (7 < (local_248 & 0xf)) {
        for (; local_2a0 <= local_248 - 8; local_2a0 = local_2a0 + 8) {
          if ((local_248 & 7) == 0) {
            *(ulong *)(local_290 + local_2a0 + local_298 * local_248) =
                 *(ulong *)(local_290 + local_2a0 + local_298 * local_248) &
                 (local_2b8 ^ 0xffffffffffffffff) | *(ulong *)(local_288 + local_2a0) & local_2b8;
          }
          else {
            *(ulong *)(local_290 + local_2a0 + local_298 * local_248) =
                 *(ulong *)(local_290 + local_2a0 + local_298 * local_248) &
                 (local_2b8 ^ 0xffffffffffffffff) | *(ulong *)(local_288 + local_2a0) & local_2b8;
          }
        }
      }
      if ((local_248 & 7) != 0) {
        for (; local_2a0 < local_248; local_2a0 = local_2a0 + 1) {
          local_290[local_2a0 + local_298 * local_248] =
               local_290[local_2a0 + local_298 * local_248] & ((byte)local_2b8 ^ 0xff) |
               local_288[local_2a0] & (byte)local_2b8;
        }
      }
      local_280 = CONCAT44(local_280._4_4_ - local_270._4_4_,(int)local_280 - (int)local_270);
      uStack_278 = CONCAT44(uStack_278._4_4_ - uStack_268._4_4_,(int)uStack_278 - (int)uStack_268);
    }
    local_170 = uVar14 & 0xf;
    local_400 = (ulong)local_170;
    local_428 = local_2720;
    local_430 = local_2520;
    local_3f0 = 0x100;
    local_3f8 = 0x10;
    local_138 = 1;
    local_13c = 1;
    local_150 = 1;
    uStack_14c = 1;
    uStack_148 = 1;
    uStack_144 = 1;
    local_410 = 0x100000001;
    uStack_408 = 0x100000001;
    local_420 = CONCAT44(uVar14,uVar14) & 0xf0000000f;
    uStack_418 = CONCAT44(uVar14,uVar14) & 0xf0000000f;
    local_3e8 = local_430;
    local_3e0 = local_428;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    local_160 = local_170;
    uStack_158 = local_400;
    memset(local_428,0,0x100);
    for (local_438 = 0; local_438 < local_3f8; local_438 = local_438 + 1) {
      local_100 = local_420;
      uStack_f8 = uStack_418;
      local_70 = 0;
      uStack_68 = 0;
      local_e0 = local_420;
      uVar11 = local_e0;
      uStack_d8 = uStack_418;
      uVar12 = uStack_d8;
      local_f0 = 0;
      uStack_e8 = 0;
      local_e0._0_4_ = (int)local_420;
      local_e0._4_4_ = (int)(local_420 >> 0x20);
      uStack_d8._0_4_ = (int)uStack_418;
      uStack_d8._4_4_ = (int)(uStack_418 >> 0x20);
      local_450 = -(uint)((int)local_e0 == 0);
      iStack_44c = -(uint)(local_e0._4_4_ == 0);
      iStack_448 = -(uint)((int)uStack_d8 == 0);
      iStack_444 = -(uint)(uStack_d8._4_4_ == 0);
      for (local_440 = 0; local_440 <= local_3f0 - 0x10; local_440 = local_440 + 0x10) {
        if ((local_3f0 & 0xf) == 0) {
          uVar10 = *(ulong *)((long)(local_430 + local_440 + local_438 * local_3f0) + 8);
          uVar9 = *(ulong *)((long)(local_428 + local_440) + 8);
          *(ulong *)(local_428 + local_440) =
               CONCAT44(iStack_44c,local_450) &
               *(ulong *)(local_430 + local_440 + local_438 * local_3f0) |
               *(ulong *)(local_428 + local_440);
          *(ulong *)((long)(local_428 + local_440) + 8) =
               CONCAT44(iStack_444,iStack_448) & uVar10 | uVar9;
        }
        else {
          uVar10 = *(ulong *)((long)(local_430 + local_440 + local_438 * local_3f0) + 8);
          uVar9 = *(ulong *)((long)(local_428 + local_440) + 8);
          *(ulong *)(local_428 + local_440) =
               *(ulong *)(local_428 + local_440) |
               CONCAT44(iStack_44c,local_450) &
               *(ulong *)(local_430 + local_440 + local_438 * local_3f0);
          *(ulong *)((long)(local_428 + local_440) + 8) =
               uVar9 | CONCAT44(iStack_444,iStack_448) & uVar10;
        }
      }
      local_e0 = uVar11;
      uStack_d8 = uVar12;
      local_458 = word_is_zero(local_400 ^ local_438);
      if (7 < (local_3f0 & 0xf)) {
        for (; local_440 <= local_3f0 - 8; local_440 = local_440 + 8) {
          if ((local_3f0 & 7) == 0) {
            *(uint64_t *)(local_428 + local_440) =
                 local_458 & *(ulong *)(local_430 + local_440 + local_438 * local_3f0) |
                 *(ulong *)(local_428 + local_440);
          }
          else {
            *(uint64_t *)(local_428 + local_440) =
                 local_458 & *(ulong *)(local_430 + local_440 + local_438 * local_3f0) |
                 *(ulong *)(local_428 + local_440);
          }
        }
      }
      if ((local_3f0 & 7) != 0) {
        for (; local_440 < local_3f0; local_440 = local_440 + 1) {
          local_428[local_440] =
               local_428[local_440] | (byte)local_458 & local_430[local_440 + local_438 * local_3f0]
          ;
        }
      }
      local_420 = CONCAT44(local_420._4_4_ - local_410._4_4_,(int)local_420 - (int)local_410);
      uStack_418 = CONCAT44(uStack_418._4_4_ - uStack_408._4_4_,(int)uStack_418 - (int)uStack_408);
    }
    local_358 = swap ^ uVar15;
    local_350 = &local_2820;
    gf_cond_swap(local_350,&gStack_27e0,local_358);
    gf_cond_neg(in_stack_ffffffffffffd7a0,in_stack_ffffffffffffd798);
    puVar16 = local_2720;
    add_pniels_to_pt(p,pn_00,(int)((ulong)in_stack_ffffffffffffd7a0 >> 0x20));
    local_1e0 = uVar14 & 0xf;
    local_2c0 = local_2520;
    local_2c8 = puVar16;
    local_2d0 = 0x100;
    local_2d8 = 0x10;
    local_2e0 = (ulong)local_1e0;
    local_1b8 = 1;
    local_1bc = 1;
    local_1d0 = 1;
    uStack_1cc = 1;
    uStack_1c8 = 1;
    uStack_1c4 = 1;
    local_2f0 = 0x100000001;
    uStack_2e8 = 0x100000001;
    uStack_1d8 = (ulong)local_1e0;
    local_1f0 = local_1e0;
    uStack_1ec = local_1e0;
    uStack_1e8 = local_1e0;
    uStack_1e4 = local_1e0;
    local_300 = CONCAT44(uVar14,uVar14) & 0xf0000000f;
    uStack_2f8 = CONCAT44(uVar14,uVar14) & 0xf0000000f;
    local_308 = puVar16;
    local_310 = local_2520;
    for (local_318 = 0; local_318 < local_2d8; local_318 = local_318 + 1) {
      local_120 = local_300;
      uStack_118 = uStack_2f8;
      local_50 = 0;
      uStack_48 = 0;
      local_a0 = local_300;
      uVar15 = local_a0;
      uStack_98 = uStack_2f8;
      uVar11 = uStack_98;
      local_b0 = 0;
      uStack_a8 = 0;
      local_a0._0_4_ = (int)local_300;
      local_a0._4_4_ = (int)(local_300 >> 0x20);
      uStack_98._0_4_ = (int)uStack_2f8;
      uStack_98._4_4_ = (int)(uStack_2f8 >> 0x20);
      local_330 = -(uint)((int)local_a0 == 0);
      uStack_32c = -(uint)(local_a0._4_4_ == 0);
      uStack_328 = -(uint)((int)uStack_98 == 0);
      uStack_324 = -(uint)(uStack_98._4_4_ == 0);
      for (local_320 = 0; local_320 <= local_2d0 - 0x10; local_320 = local_320 + 0x10) {
        if ((local_2d0 & 0xf) == 0) {
          puVar1 = (uint *)(local_310 + local_320 + local_318 * local_2d0);
          uVar5 = puVar1[1];
          uVar6 = puVar1[2];
          uVar7 = puVar1[3];
          puVar2 = (uint *)(local_308 + local_320);
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          uVar4 = puVar2[3];
          puVar3 = (uint *)(local_310 + local_320 + local_318 * local_2d0);
          *puVar3 = *puVar1 & (local_330 ^ 0xffffffff) | *puVar2 & local_330;
          puVar3[1] = uVar5 & (uStack_32c ^ 0xffffffff) | uVar13 & uStack_32c;
          puVar3[2] = uVar6 & (uStack_328 ^ 0xffffffff) | uVar14 & uStack_328;
          puVar3[3] = uVar7 & (uStack_324 ^ 0xffffffff) | uVar4 & uStack_324;
        }
        else {
          puVar1 = (uint *)(local_310 + local_320 + local_318 * local_2d0);
          uVar5 = puVar1[1];
          uVar6 = puVar1[2];
          uVar7 = puVar1[3];
          puVar2 = (uint *)(local_308 + local_320);
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          uVar4 = puVar2[3];
          puVar3 = (uint *)(local_310 + local_320 + local_318 * local_2d0);
          *puVar3 = *puVar1 & (local_330 ^ 0xffffffff) | *puVar2 & local_330;
          puVar3[1] = uVar5 & (uStack_32c ^ 0xffffffff) | uVar13 & uStack_32c;
          puVar3[2] = uVar6 & (uStack_328 ^ 0xffffffff) | uVar14 & uStack_328;
          puVar3[3] = uVar7 & (uStack_324 ^ 0xffffffff) | uVar4 & uStack_324;
        }
      }
      local_a0 = uVar15;
      uStack_98 = uVar11;
      local_338 = word_is_zero(local_2e0 ^ local_318);
      if (7 < (local_2d0 & 0xf)) {
        for (; local_320 <= local_2d0 - 8; local_320 = local_320 + 8) {
          if ((local_2d0 & 7) == 0) {
            *(ulong *)(local_310 + local_320 + local_318 * local_2d0) =
                 *(ulong *)(local_310 + local_320 + local_318 * local_2d0) &
                 (local_338 ^ 0xffffffffffffffff) | *(ulong *)(local_308 + local_320) & local_338;
          }
          else {
            *(ulong *)(local_310 + local_320 + local_318 * local_2d0) =
                 *(ulong *)(local_310 + local_320 + local_318 * local_2d0) &
                 (local_338 ^ 0xffffffffffffffff) | *(ulong *)(local_308 + local_320) & local_338;
          }
        }
      }
      if ((local_2d0 & 7) != 0) {
        for (; local_320 < local_2d0; local_320 = local_320 + 1) {
          local_310[local_320 + local_318 * local_2d0] =
               local_310[local_320 + local_318 * local_2d0] & ((byte)local_338 ^ 0xff) |
               local_308[local_320] & (byte)local_338;
        }
      }
      local_300 = CONCAT44(local_300._4_4_ - local_2f0._4_4_,(int)local_300 - (int)local_2f0);
      uStack_2f8 = CONCAT44(uStack_2f8._4_4_ - uStack_2e8._4_4_,(int)uStack_2f8 - (int)uStack_2e8);
    }
  }
  decaf_448_point_copy(in_stack_ffffffffffffd768,in_stack_ffffffffffffd760);
  decaf_448_point_copy(in_stack_ffffffffffffd768,in_stack_ffffffffffffd760);
  for (local_2824 = 0xf; 1 < local_2824; local_2824 = local_2824 + -1) {
    decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                        (decaf_448_point_s *)
                        CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
    decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                        (decaf_448_point_s *)
                        CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
    decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                        (decaf_448_point_s *)
                        CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
    decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                        (decaf_448_point_s *)
                        CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
  }
  decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                      (decaf_448_point_s *)
                      CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
  decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                      (decaf_448_point_s *)
                      CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
  point_double_internal
            (in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,in_stack_ffffffffffffd874);
  point_double_internal
            (in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,in_stack_ffffffffffffd874);
  decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                      (decaf_448_point_s *)
                      CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
  decaf_448_point_add(in_stack_ffffffffffffd880,in_stack_ffffffffffffd878,
                      (decaf_448_point_s *)
                      CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870));
  decaf_bzero(&local_4d0,0x38);
  decaf_bzero(&local_510,0x38);
  decaf_bzero(&local_2820,0x100);
  decaf_bzero(local_1520,0x1000);
  decaf_bzero(local_2520,0x1000);
  decaf_bzero(local_2720,0x100);
  decaf_bzero(local_2620,0x100);
  return;
}

Assistant:

void API_NS(point_dual_scalarmul) (
    point_t a1,
    point_t a2,
    const point_t b,
    const scalar_t scalar1,
    const scalar_t scalar2
) {
    
    const int WINDOW = DECAF_WINDOW_BITS,
        WINDOW_MASK = (1<<WINDOW)-1,
        WINDOW_T_MASK = WINDOW_MASK >> 1,
        NTABLE = 1<<(WINDOW-1);


    scalar_t scalar1x, scalar2x;
    API_NS(scalar_add)(scalar1x, scalar1, point_scalarmul_adjustment);
    API_NS(scalar_halve)(scalar1x,scalar1x);
    API_NS(scalar_add)(scalar2x, scalar2, point_scalarmul_adjustment);
    API_NS(scalar_halve)(scalar2x,scalar2x);
    
    /* Set up a precomputed table with odd multiples of b. */
    point_t multiples1[1<<((int)(DECAF_WINDOW_BITS)-1)], multiples2[1<<((int)(DECAF_WINDOW_BITS)-1)], working, tmp;
    // Array sizes above equal NTABLE (MSVC compatibility issue)

    pniels_t pn;
    
    API_NS(point_copy)(working, b);

    /* Initialize. */
    int i,j;
    
    for (i=0; i<NTABLE; i++) {
        API_NS(point_copy)(multiples1[i], API_NS(point_identity));
        API_NS(point_copy)(multiples2[i], API_NS(point_identity));
    }

    for (i=0; i<SCALAR_BITS; i+=WINDOW) {   
        if (i) {
            for (j=0; j<WINDOW-1; j++)
                point_double_internal(working, working, -1);
            point_double_internal(working, working, 0);
        }
        
        /* Fetch another block of bits */
        word_t bits1 = scalar1x->limb[i/WBITS] >> (i%WBITS),
               bits2 = scalar2x->limb[i/WBITS] >> (i%WBITS);
        if (i%WBITS >= WBITS-WINDOW && i/WBITS<SCALAR_LIMBS-1) {
            bits1 ^= scalar1x->limb[i/WBITS+1] << (WBITS - (i%WBITS));
            bits2 ^= scalar2x->limb[i/WBITS+1] << (WBITS - (i%WBITS));
        }
        bits1 &= WINDOW_MASK;
        bits2 &= WINDOW_MASK;
        mask_t inv1 = (bits1>>(WINDOW-1))-1;
        mask_t inv2 = (bits2>>(WINDOW-1))-1;
        bits1 ^= inv1;
        bits2 ^= inv2;
        
        pt_to_pniels(pn, working);

        constant_time_lookup(tmp, multiples1, sizeof(tmp), NTABLE, bits1 & WINDOW_T_MASK);
        cond_neg_niels(pn->n, inv1);
        /* add_pniels_to_pt(multiples1[bits1 & WINDOW_T_MASK], pn, 0); */
        add_pniels_to_pt(tmp, pn, 0);
        constant_time_insert(multiples1, tmp, sizeof(tmp), NTABLE, bits1 & WINDOW_T_MASK);
        
        
        constant_time_lookup(tmp, multiples2, sizeof(tmp), NTABLE, bits2 & WINDOW_T_MASK);
        cond_neg_niels(pn->n, inv1^inv2);
        /* add_pniels_to_pt(multiples2[bits2 & WINDOW_T_MASK], pn, 0); */
        add_pniels_to_pt(tmp, pn, 0);
        constant_time_insert(multiples2, tmp, sizeof(tmp), NTABLE, bits2 & WINDOW_T_MASK);
    }
    
    if (NTABLE > 1) {
        API_NS(point_copy)(working, multiples1[NTABLE-1]);
        API_NS(point_copy)(tmp    , multiples2[NTABLE-1]);
    
        for (i=NTABLE-1; i>1; i--) {
            API_NS(point_add)(multiples1[i-1], multiples1[i-1], multiples1[i]);
            API_NS(point_add)(multiples2[i-1], multiples2[i-1], multiples2[i]);
            API_NS(point_add)(working, working, multiples1[i-1]);
            API_NS(point_add)(tmp,     tmp,     multiples2[i-1]);
        }
    
        API_NS(point_add)(multiples1[0], multiples1[0], multiples1[1]);
        API_NS(point_add)(multiples2[0], multiples2[0], multiples2[1]);
        point_double_internal(working, working, 0);
        point_double_internal(tmp,         tmp, 0);
        API_NS(point_add)(a1, working, multiples1[0]);
        API_NS(point_add)(a2, tmp,     multiples2[0]);
    } else {
        API_NS(point_copy)(a1, multiples1[0]);
        API_NS(point_copy)(a2, multiples2[0]);
    }

    decaf_bzero(scalar1x,sizeof(scalar1x));
    decaf_bzero(scalar2x,sizeof(scalar2x));
    decaf_bzero(pn,sizeof(pn));
    decaf_bzero(multiples1,sizeof(multiples1));
    decaf_bzero(multiples2,sizeof(multiples2));
    decaf_bzero(tmp,sizeof(tmp));
    decaf_bzero(working,sizeof(working));
}